

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::RunContext::getCurrentTestName_abi_cxx11_(RunContext *this)

{
  TestCaseInfo *pTVar1;
  long in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  if (*(long *)(in_RSI + 0x38) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    pTVar1 = TestCase::getTestCaseInfo(*(TestCase **)(in_RSI + 0x38));
    std::__cxx11::string::string(in_RDI,(string *)pTVar1);
  }
  return in_RDI;
}

Assistant:

virtual std::string getCurrentTestName() const {
            return m_activeTestCase
                ? m_activeTestCase->getTestCaseInfo().name
                : "";
        }